

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O3

BVIndex __thiscall BVStatic<256UL>::Count(BVStatic<256UL> *this)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  undefined4 *puVar4;
  uint uVar5;
  BVIndex i;
  long lVar6;
  
  lVar6 = 0;
  uVar5 = 0;
  do {
    BVar3 = BVUnitT<unsigned_long>::CountBit(this->data[lVar6].word);
    uVar5 = uVar5 + BVar3;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  if (0x100 < uVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.h"
                       ,0x1f6,"(sum <= bitCount)","sum <= bitCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return uVar5;
}

Assistant:

BVIndex Count() const
    {
        BVIndex sum = 0;
        for (BVIndex i = 0; i < wordCount; i++)
        {
            sum += this->data[i].Count();
        }

        Assert(sum <= bitCount);
        return sum;
    }